

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_0::MeshVisitor
               (Path *abs_path,Prim *prim,int32_t level,void *userdata,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pPVar4;
  Stage *pSVar5;
  pointer pcVar6;
  GeomSubset *this;
  RenderSceneConverter *pRVar7;
  pointer ppGVar8;
  bool bVar9;
  int iVar10;
  mapped_type *pmVar11;
  long *plVar12;
  RenderMesh *args;
  GeomMesh *mesh;
  size_type *psVar13;
  pointer ppGVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  const_iterator __end2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  MaterialPath *this_00;
  const_iterator __begin2;
  pointer pPVar17;
  ulong val;
  string *err_local;
  MeshVisitorEnv *visitorEnv;
  string local_7c8;
  string backface_purpose;
  Material *bound_material;
  pointer ppStack_770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_768;
  MaterialPath material_path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e8;
  _Alloc_hider local_6d8;
  size_type local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  _Alloc_hider local_6b8;
  size_type local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  bool local_698;
  storage_t<tinyusdz::Path::PathType> local_694;
  bool local_690;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_670;
  pointer local_668;
  GeomSubset *psubset;
  size_type local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  _Alloc_hider local_640;
  size_type local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_630;
  undefined8 local_620;
  _Alloc_hider local_618;
  size_type local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5f0;
  anon_class_16_2_91e644f1 ConvertBoundMaterial;
  int64_t rmaterial_id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  int64_t rmaterial_id_1;
  pointer ppStack_5b0;
  pointer local_5a8;
  Prim *local_5a0;
  GeomMesh *local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_590;
  pointer local_588;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
  subset_material_path_map;
  Path subset_abs_path;
  _Rb_tree_node_base local_390;
  size_t local_370;
  _Rb_tree_node_base local_360;
  size_t local_340;
  _Alloc_hider local_338;
  size_type local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined8 local_318;
  uint32_t local_310;
  pointer local_308;
  pointer puStack_300;
  pointer local_2f8;
  pointer puStack_2f0;
  pointer local_2e8;
  pointer puStack_2e0;
  VertexVariability local_2d8;
  uint64_t local_2d0;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined8 local_2a8;
  uint32_t local_2a0;
  pointer local_298;
  pointer puStack_290;
  pointer local_288;
  pointer puStack_280;
  pointer local_278;
  pointer puStack_270;
  VertexVariability local_268;
  uint64_t local_260;
  bool local_258;
  undefined1 local_254 [16];
  bool local_244;
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  undefined8 local_220;
  uint32_t local_218;
  pointer local_210;
  pointer puStack_208;
  pointer local_200;
  pointer puStack_1f8;
  pointer local_1f0;
  pointer puStack_1e8;
  VertexVariability local_1e0;
  uint64_t local_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined8 local_1b0;
  uint32_t local_1a8;
  pointer local_1a0;
  pointer puStack_198;
  pointer local_190;
  pointer puStack_188;
  pointer local_180;
  pointer puStack_178;
  VertexVariability local_170;
  uint64_t local_168;
  double local_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  double dStack_118;
  double local_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  pointer local_e0;
  pointer piStack_d8;
  pointer local_d0;
  pointer pfStack_c8;
  pointer local_c0;
  pointer pfStack_b8;
  int local_b0;
  int local_a8;
  _Rb_tree_node_base local_98;
  size_t local_78;
  undefined8 local_70;
  _Rb_tree_node_base local_60;
  size_t local_40;
  uint64_t uStack_38;
  
  err_local = err;
  if ((userdata == (void *)0x0) || (visitorEnv = (MeshVisitorEnv *)userdata, 0x100000 < level)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
LAB_0034f702:
    bVar9 = false;
  }
  else {
    local_598 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(&prim->_data,false);
    if (local_598 != (GeomMesh *)0x0) {
      if (((((local_598->points)._attrib.has_value_ == false) &&
           ((local_598->points)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (local_598->points)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start)) && ((local_598->points)._value_empty == false)) &&
         ((local_598->points)._blocked != true)) {
        return true;
      }
      ConvertBoundMaterial.visitorEnv = &visitorEnv;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_688.
      super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_688.
      super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_688.
      super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pPVar17 = (prim->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar4 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      material_path.material_path.field_2._M_allocated_capacity = 0;
      material_path.material_path._M_dataplus._M_p = (pointer)0x0;
      material_path.material_path._M_string_length = 0;
      local_5a0 = prim;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pPVar17 == pPVar4) {
        local_688.
        super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_688.
        super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_688.
        super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ConvertBoundMaterial.err = &err_local;
      }
      else {
        paVar16 = &subset_abs_path._prim_part.field_2;
        ConvertBoundMaterial.err = &err_local;
        do {
          psubset = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(&pPVar17->_data,false);
          if (psubset != (GeomSubset *)0x0) {
            subset_abs_path._prim_part._M_string_length = 0;
            subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
            subset_abs_path._prim_part._M_dataplus._M_p = (pointer)paVar16;
            if ((psubset->familyName)._attrib.has_value_ == true) {
              ::std::__cxx11::string::_M_assign((string *)&subset_abs_path);
              iVar10 = ::std::__cxx11::string::compare((char *)&subset_abs_path);
              if (iVar10 == 0) {
                if (material_path.material_path._M_string_length ==
                    material_path.material_path.field_2._M_allocated_capacity) {
                  ::std::
                  vector<tinyusdz::GeomSubset_const*,std::allocator<tinyusdz::GeomSubset_const*>>::
                  _M_realloc_insert<tinyusdz::GeomSubset_const*const&>
                            ((vector<tinyusdz::GeomSubset_const*,std::allocator<tinyusdz::GeomSubset_const*>>
                              *)&material_path,
                             (iterator)material_path.material_path._M_string_length,&psubset);
                }
                else {
                  *(GeomSubset **)material_path.material_path._M_string_length = psubset;
                  material_path.material_path._M_string_length =
                       material_path.material_path._M_string_length + 8;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subset_abs_path._prim_part._M_dataplus._M_p != paVar16) {
                operator_delete(subset_abs_path._prim_part._M_dataplus._M_p,
                                CONCAT71(subset_abs_path._prim_part.field_2._M_allocated_capacity.
                                         _1_7_,subset_abs_path._prim_part.field_2._M_local_buf[0]) +
                                1);
              }
            }
          }
          ppGVar8 = local_688.
                    super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppGVar14 = local_688.
                     super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pPVar17 = pPVar17 + 1;
        } while (pPVar17 != pPVar4);
        local_688.
        super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)material_path.material_path._M_dataplus._M_p;
        local_688.
        super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)material_path.material_path._M_string_length;
        local_688.
        super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)material_path.material_path.field_2._M_allocated_capacity;
        material_path.material_path._M_dataplus._M_p = (pointer)0x0;
        material_path.material_path._M_string_length = 0;
        material_path.material_path.field_2._M_allocated_capacity = 0;
        if ((ppGVar14 != (pointer)0x0) &&
           (operator_delete(ppGVar14,(long)ppGVar8 - (long)ppGVar14),
           material_path.material_path._M_dataplus._M_p != (pointer)0x0)) {
          operator_delete(material_path.material_path._M_dataplus._M_p,
                          material_path.material_path.field_2._M_allocated_capacity -
                          (long)material_path.material_path._M_dataplus._M_p);
        }
      }
      local_588 = local_688.
                  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_688.
          super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_688.
          super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        paVar16 = &local_6c8;
        paVar15 = &local_6a8;
        local_5f8 = &subset_abs_path._element.field_2;
        local_5f0 = &subset_abs_path._variant_part_str.field_2;
        ppGVar14 = local_688.
                   super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_670 = paVar15;
        local_590 = paVar16;
        do {
          psubset = (GeomSubset *)&local_650;
          local_658 = 0;
          local_650._M_local_buf[0] = '\0';
          local_640._M_p = (pointer)&local_630;
          local_638 = 0;
          local_630._M_local_buf[0] = '\0';
          local_620._0_4_ = -1;
          local_620._4_4_ = -1;
          local_618._M_p = (pointer)&local_608;
          local_608._M_allocated_capacity._0_2_ = 0x7473;
          local_610 = 2;
          local_608._M_local_buf[2] = '\0';
          ::std::__cxx11::string::_M_assign((string *)&local_618);
          local_668 = ppGVar14;
          Path::AppendElement(&subset_abs_path,abs_path,&(*ppGVar14)->name);
          material_path.material_path._M_dataplus._M_p =
               (pointer)&material_path.material_path.field_2;
          material_path.material_path._M_string_length = 0;
          material_path.material_path.field_2._M_allocated_capacity =
               material_path.material_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
          material_path.backface_material_path._M_string_length = 0;
          material_path.backface_material_path.field_2._M_local_buf[0] = '\0';
          material_path.default_texcoords_primvar_name._M_dataplus._M_p = (pointer)0x0;
          material_path.default_texcoords_primvar_name._M_string_length =
               material_path.default_texcoords_primvar_name._M_string_length & 0xffffffffffffff00;
          local_6e8._M_local_buf[0] = '\0';
          local_6d0 = 0;
          local_6c8._M_local_buf[0] = '\0';
          local_6b0 = 0;
          local_6a8._M_local_buf[0] = '\0';
          local_698 = false;
          local_694 = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_690 = false;
          bound_material = (Material *)0x0;
          pSVar5 = visitorEnv->env->stage;
          paVar1 = &backface_purpose.field_2;
          backface_purpose._M_dataplus._M_p = (pointer)paVar1;
          material_path.backface_material_path._M_dataplus._M_p =
               (pointer)&material_path.backface_material_path.field_2;
          material_path._64_8_ = &material_path.default_texcoords_primvar_name._M_string_length;
          material_path.default_texcoords_primvar_name.field_2._8_8_ = &local_6e8;
          local_6d8._M_p = (pointer)paVar16;
          local_6b8._M_p = (pointer)paVar15;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&backface_purpose,"");
          bVar9 = GetBoundMaterial(pSVar5,&subset_abs_path,&backface_purpose,(Path *)&material_path,
                                   &bound_material,err_local);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)backface_purpose._M_dataplus._M_p != paVar1) {
            operator_delete(backface_purpose._M_dataplus._M_p,
                            backface_purpose.field_2._M_allocated_capacity + 1);
          }
          paVar15 = local_670;
          if (bVar9 && bound_material != (Material *)0x0) {
            rmaterial_id = -1;
            bVar9 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                              (&ConvertBoundMaterial,(Path *)&material_path,bound_material,
                               &rmaterial_id);
            if (!bVar9) {
              if (err_local != (string *)0x0) {
                Path::full_path_name_abi_cxx11_(&local_7c8,(Path *)&material_path);
                plVar12 = (long *)::std::__cxx11::string::replace
                                            ((ulong)&local_7c8,0,(char *)0x0,0x5e4df1);
                psVar13 = (size_type *)(plVar12 + 2);
                if ((size_type *)*plVar12 == psVar13) {
                  backface_purpose.field_2._M_allocated_capacity = *psVar13;
                  backface_purpose.field_2._8_8_ = plVar12[3];
                  backface_purpose._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  backface_purpose.field_2._M_allocated_capacity = *psVar13;
                  backface_purpose._M_dataplus._M_p = (pointer)*plVar12;
                }
                backface_purpose._M_string_length = plVar12[1];
                *plVar12 = (long)psVar13;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)err_local,(ulong)backface_purpose._M_dataplus._M_p);
                paVar15 = local_670;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)backface_purpose._M_dataplus._M_p != paVar1) {
                  operator_delete(backface_purpose._M_dataplus._M_p,
                                  backface_purpose.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
                  operator_delete(local_7c8._M_dataplus._M_p,
                                  local_7c8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6b8._M_p != paVar15) {
                operator_delete(local_6b8._M_p,
                                CONCAT71(local_6a8._M_allocated_capacity._1_7_,
                                         local_6a8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6d8._M_p != paVar16) {
                operator_delete(local_6d8._M_p,
                                CONCAT71(local_6c8._M_allocated_capacity._1_7_,
                                         local_6c8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)material_path.default_texcoords_primvar_name.field_2._8_8_ != &local_6e8) {
                operator_delete((void *)material_path.default_texcoords_primvar_name.field_2._8_8_,
                                CONCAT71(local_6e8._M_allocated_capacity._1_7_,
                                         local_6e8._M_local_buf[0]) + 1);
              }
              if ((size_type *)material_path._64_8_ !=
                  &material_path.default_texcoords_primvar_name._M_string_length) {
                operator_delete((void *)material_path._64_8_,
                                material_path.default_texcoords_primvar_name._M_string_length + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)material_path.backface_material_path._M_dataplus._M_p !=
                  &material_path.backface_material_path.field_2) {
                operator_delete(material_path.backface_material_path._M_dataplus._M_p,
                                CONCAT71(material_path.backface_material_path.field_2.
                                         _M_allocated_capacity._1_7_,
                                         material_path.backface_material_path.field_2._M_local_buf
                                         [0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)material_path.material_path._M_dataplus._M_p !=
                  &material_path.material_path.field_2) {
                operator_delete(material_path.material_path._M_dataplus._M_p,
                                material_path.material_path.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subset_abs_path._element._M_dataplus._M_p != local_5f8) {
                operator_delete(subset_abs_path._element._M_dataplus._M_p,
                                CONCAT71(subset_abs_path._element.field_2._M_allocated_capacity.
                                         _1_7_,subset_abs_path._element.field_2._M_local_buf[0]) + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subset_abs_path._variant_part_str._M_dataplus._M_p != local_5f0) {
                operator_delete(subset_abs_path._variant_part_str._M_dataplus._M_p,
                                CONCAT71(subset_abs_path._variant_part_str.field_2.
                                         _M_allocated_capacity._1_7_,
                                         subset_abs_path._variant_part_str.field_2._M_local_buf[0])
                                + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subset_abs_path._variant_selection_part._M_dataplus._M_p !=
                  &subset_abs_path._variant_selection_part.field_2) {
                operator_delete(subset_abs_path._variant_selection_part._M_dataplus._M_p,
                                CONCAT71(subset_abs_path._variant_selection_part.field_2.
                                         _M_allocated_capacity._1_7_,
                                         subset_abs_path._variant_selection_part.field_2.
                                         _M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subset_abs_path._variant_part._M_dataplus._M_p !=
                  &subset_abs_path._variant_part.field_2) {
                operator_delete(subset_abs_path._variant_part._M_dataplus._M_p,
                                CONCAT71(subset_abs_path._variant_part.field_2._M_allocated_capacity
                                         ._1_7_,subset_abs_path._variant_part.field_2._M_local_buf
                                                [0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subset_abs_path._prop_part._M_dataplus._M_p !=
                  &subset_abs_path._prop_part.field_2) {
                operator_delete(subset_abs_path._prop_part._M_dataplus._M_p,
                                CONCAT71(subset_abs_path._prop_part.field_2._M_allocated_capacity.
                                         _1_7_,subset_abs_path._prop_part.field_2._M_local_buf[0]) +
                                1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)subset_abs_path._prim_part._M_dataplus._M_p !=
                  &subset_abs_path._prim_part.field_2) {
                operator_delete(subset_abs_path._prim_part._M_dataplus._M_p,
                                CONCAT71(subset_abs_path._prim_part.field_2._M_allocated_capacity.
                                         _1_7_,subset_abs_path._prim_part.field_2._M_local_buf[0]) +
                                1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_618._M_p != &local_608) {
                operator_delete(local_618._M_p,
                                CONCAT53(local_608._M_allocated_capacity._3_5_,
                                         CONCAT12(local_608._M_local_buf[2],
                                                  local_608._M_allocated_capacity._0_2_)) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_640._M_p != &local_630) {
                operator_delete(local_640._M_p,
                                CONCAT71(local_630._M_allocated_capacity._1_7_,
                                         local_630._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psubset != &local_650) {
                operator_delete(psubset,CONCAT71(local_650._M_allocated_capacity._1_7_,
                                                 local_650._M_local_buf[0]) + 1);
              }
              goto LAB_003513d0;
            }
            Path::full_path_name_abi_cxx11_(&backface_purpose,(Path *)&material_path);
            ::std::__cxx11::string::operator=((string *)&psubset,(string *)&backface_purpose);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)backface_purpose._M_dataplus._M_p != paVar1) {
              operator_delete(backface_purpose._M_dataplus._M_p,
                              backface_purpose.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b8._M_p != paVar15) {
            operator_delete(local_6b8._M_p,
                            CONCAT71(local_6a8._M_allocated_capacity._1_7_,local_6a8._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8._M_p != paVar16) {
            operator_delete(local_6d8._M_p,
                            CONCAT71(local_6c8._M_allocated_capacity._1_7_,local_6c8._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)material_path.default_texcoords_primvar_name.field_2._8_8_ != &local_6e8) {
            operator_delete((void *)material_path.default_texcoords_primvar_name.field_2._8_8_,
                            CONCAT71(local_6e8._M_allocated_capacity._1_7_,local_6e8._M_local_buf[0]
                                    ) + 1);
          }
          if ((size_type *)material_path._64_8_ !=
              &material_path.default_texcoords_primvar_name._M_string_length) {
            operator_delete((void *)material_path._64_8_,
                            material_path.default_texcoords_primvar_name._M_string_length + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)material_path.backface_material_path._M_dataplus._M_p !=
              &material_path.backface_material_path.field_2) {
            operator_delete(material_path.backface_material_path._M_dataplus._M_p,
                            CONCAT71(material_path.backface_material_path.field_2.
                                     _M_allocated_capacity._1_7_,
                                     material_path.backface_material_path.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)material_path.material_path._M_dataplus._M_p !=
              &material_path.material_path.field_2) {
            operator_delete(material_path.material_path._M_dataplus._M_p,
                            material_path.material_path.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = (visitorEnv->env->material_config).default_backface_material_purpose_name.
                   _M_dataplus._M_p;
          backface_purpose._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&backface_purpose,pcVar6,
                     pcVar6 + (visitorEnv->env->material_config).
                              default_backface_material_purpose_name._M_string_length);
          if (backface_purpose._M_string_length != 0) {
            this = *local_668;
            paVar2 = &material_path.material_path.field_2;
            material_path.material_path._M_string_length = 0;
            material_path.material_path.field_2._M_allocated_capacity =
                 material_path.material_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
            material_path.material_path._M_dataplus._M_p = (pointer)paVar2;
            ::std::__cxx11::string::_M_assign((string *)&material_path);
            bVar9 = MaterialBinding::has_materialBinding
                              (&this->super_MaterialBinding,(token *)&material_path);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)material_path.material_path._M_dataplus._M_p != paVar2) {
              operator_delete(material_path.material_path._M_dataplus._M_p,
                              material_path.material_path.field_2._M_allocated_capacity + 1);
            }
            paVar16 = local_590;
            paVar15 = local_670;
            if (bVar9) {
              material_path.material_path._M_dataplus._M_p =
                   (pointer)&material_path.material_path.field_2;
              material_path.material_path._M_string_length = 0;
              material_path.material_path.field_2._M_allocated_capacity =
                   material_path.material_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
              material_path.backface_material_path._M_dataplus._M_p =
                   (pointer)&material_path.backface_material_path.field_2;
              material_path.backface_material_path._M_string_length = 0;
              material_path.backface_material_path.field_2._M_local_buf[0] = '\0';
              material_path._64_8_ = &material_path.default_texcoords_primvar_name._M_string_length;
              material_path.default_texcoords_primvar_name._M_dataplus._M_p = (pointer)0x0;
              material_path.default_texcoords_primvar_name._M_string_length =
                   material_path.default_texcoords_primvar_name._M_string_length &
                   0xffffffffffffff00;
              local_6e8._M_local_buf[0] = '\0';
              local_6d8._M_p = (pointer)local_590;
              local_6d0 = 0;
              local_6c8._M_local_buf[0] = '\0';
              local_6b8._M_p = (pointer)local_670;
              local_6b0 = 0;
              local_6a8._M_local_buf[0] = '\0';
              local_698 = false;
              local_694 = (storage_t<tinyusdz::Path::PathType>)0x0;
              local_690 = false;
              rmaterial_id = 0;
              material_path.default_texcoords_primvar_name.field_2._8_8_ = &local_6e8;
              bVar9 = GetBoundMaterial(visitorEnv->env->stage,&subset_abs_path,
                                       &(visitorEnv->env->material_config).
                                        default_backface_material_purpose_name,
                                       (Path *)&material_path,(Material **)&rmaterial_id,err_local);
              if (rmaterial_id != 0 && bVar9) {
                rmaterial_id_1 = -1;
                bVar9 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                                  (&ConvertBoundMaterial,(Path *)&material_path,
                                   (Material *)rmaterial_id,&rmaterial_id_1);
                if (!bVar9) {
                  if (err_local != (string *)0x0) {
                    Path::full_path_name_abi_cxx11_
                              ((string *)&bound_material,(Path *)&material_path);
                    plVar12 = (long *)::std::__cxx11::string::replace
                                                ((ulong)&bound_material,0,(char *)0x0,0x5e4df1);
                    psVar13 = (size_type *)(plVar12 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar12 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar13) {
                      local_7c8.field_2._M_allocated_capacity = *psVar13;
                      local_7c8.field_2._8_8_ = plVar12[3];
                      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
                    }
                    else {
                      local_7c8.field_2._M_allocated_capacity = *psVar13;
                      local_7c8._M_dataplus._M_p = (pointer)*plVar12;
                    }
                    local_7c8._M_string_length = plVar12[1];
                    *plVar12 = (long)psVar13;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)err_local,(ulong)local_7c8._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
                      operator_delete(local_7c8._M_dataplus._M_p,
                                      local_7c8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)bound_material != &local_768) {
                      operator_delete(bound_material,(ulong)(local_768._M_allocated_capacity + 1));
                    }
                  }
                  Path::~Path((Path *)&material_path);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)backface_purpose._M_dataplus._M_p != paVar1) {
                    operator_delete(backface_purpose._M_dataplus._M_p,
                                    backface_purpose.field_2._M_allocated_capacity + 1);
                  }
                  Path::~Path(&subset_abs_path);
                  this_00 = (MaterialPath *)&psubset;
                  goto LAB_003513cb;
                }
                Path::full_path_name_abi_cxx11_(&local_7c8,(Path *)&material_path);
                ::std::__cxx11::string::operator=((string *)&local_640,(string *)&local_7c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
                  operator_delete(local_7c8._M_dataplus._M_p,
                                  local_7c8.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6b8._M_p != paVar15) {
                operator_delete(local_6b8._M_p,
                                CONCAT71(local_6a8._M_allocated_capacity._1_7_,
                                         local_6a8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6d8._M_p != paVar16) {
                operator_delete(local_6d8._M_p,
                                CONCAT71(local_6c8._M_allocated_capacity._1_7_,
                                         local_6c8._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)material_path.default_texcoords_primvar_name.field_2._8_8_ != &local_6e8) {
                operator_delete((void *)material_path.default_texcoords_primvar_name.field_2._8_8_,
                                CONCAT71(local_6e8._M_allocated_capacity._1_7_,
                                         local_6e8._M_local_buf[0]) + 1);
              }
              if ((size_type *)material_path._64_8_ !=
                  &material_path.default_texcoords_primvar_name._M_string_length) {
                operator_delete((void *)material_path._64_8_,
                                material_path.default_texcoords_primvar_name._M_string_length + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)material_path.backface_material_path._M_dataplus._M_p !=
                  &material_path.backface_material_path.field_2) {
                operator_delete(material_path.backface_material_path._M_dataplus._M_p,
                                CONCAT71(material_path.backface_material_path.field_2.
                                         _M_allocated_capacity._1_7_,
                                         material_path.backface_material_path.field_2._M_local_buf
                                         [0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)material_path.material_path._M_dataplus._M_p !=
                  &material_path.material_path.field_2) {
                operator_delete(material_path.material_path._M_dataplus._M_p,
                                material_path.material_path.field_2._M_allocated_capacity + 1);
              }
            }
          }
          pmVar11 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
                    ::operator[](&subset_material_path_map,&(*local_668)->name);
          ::std::__cxx11::string::_M_assign((string *)pmVar11);
          ::std::__cxx11::string::_M_assign((string *)&pmVar11->backface_material_path);
          pmVar11->default_material_id = (int)local_620;
          pmVar11->default_backface_material_id = local_620._4_4_;
          ::std::__cxx11::string::_M_assign((string *)&pmVar11->default_texcoords_primvar_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)backface_purpose._M_dataplus._M_p != paVar1) {
            operator_delete(backface_purpose._M_dataplus._M_p,
                            backface_purpose.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._element._M_dataplus._M_p != local_5f8) {
            operator_delete(subset_abs_path._element._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._element.field_2._M_allocated_capacity._1_7_,
                                     subset_abs_path._element.field_2._M_local_buf[0]) + 1);
          }
          paVar15 = local_670;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._variant_part_str._M_dataplus._M_p != local_5f0) {
            operator_delete(subset_abs_path._variant_part_str._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._variant_part_str.field_2._M_allocated_capacity
                                     ._1_7_,subset_abs_path._variant_part_str.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._variant_selection_part._M_dataplus._M_p !=
              &subset_abs_path._variant_selection_part.field_2) {
            operator_delete(subset_abs_path._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._variant_selection_part.field_2.
                                     _M_allocated_capacity._1_7_,
                                     subset_abs_path._variant_selection_part.field_2._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._variant_part._M_dataplus._M_p !=
              &subset_abs_path._variant_part.field_2) {
            operator_delete(subset_abs_path._variant_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._variant_part.field_2._M_allocated_capacity.
                                     _1_7_,subset_abs_path._variant_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._prop_part._M_dataplus._M_p != &subset_abs_path._prop_part.field_2)
          {
            operator_delete(subset_abs_path._prop_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._prop_part.field_2._M_allocated_capacity._1_7_,
                                     subset_abs_path._prop_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._prim_part._M_dataplus._M_p != &subset_abs_path._prim_part.field_2)
          {
            operator_delete(subset_abs_path._prim_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._prim_part.field_2._M_allocated_capacity._1_7_,
                                     subset_abs_path._prim_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._M_p != &local_608) {
            operator_delete(local_618._M_p,
                            CONCAT53(local_608._M_allocated_capacity._3_5_,
                                     CONCAT12(local_608._M_local_buf[2],
                                              local_608._M_allocated_capacity._0_2_)) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640._M_p != &local_630) {
            operator_delete(local_640._M_p,
                            CONCAT71(local_630._M_allocated_capacity._1_7_,local_630._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psubset != &local_650) {
            operator_delete(psubset,CONCAT71(local_650._M_allocated_capacity._1_7_,
                                             local_650._M_local_buf[0]) + 1);
          }
          ppGVar14 = local_668 + 1;
        } while (ppGVar14 != local_588);
      }
      material_path.material_path._M_dataplus._M_p = (pointer)&material_path.material_path.field_2;
      material_path.material_path._M_string_length = 0;
      material_path.material_path.field_2._M_allocated_capacity =
           material_path.material_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
      material_path.backface_material_path._M_dataplus._M_p =
           (pointer)&material_path.backface_material_path.field_2;
      material_path.backface_material_path._M_string_length = 0;
      material_path.backface_material_path.field_2._M_local_buf[0] = '\0';
      material_path.default_material_id = -1;
      material_path.default_backface_material_id = -1;
      material_path.default_texcoords_primvar_name._M_dataplus._M_p =
           (pointer)&material_path.default_texcoords_primvar_name.field_2;
      material_path.default_texcoords_primvar_name.field_2._M_allocated_capacity._0_2_ = 0x7473;
      material_path.default_texcoords_primvar_name._M_string_length = 2;
      material_path.default_texcoords_primvar_name.field_2._M_local_buf[2] = '\0';
      ::std::__cxx11::string::_M_assign((string *)&material_path.default_texcoords_primvar_name);
      Path::full_path_name_abi_cxx11_((string *)&psubset,abs_path);
      subset_abs_path._prim_part._M_dataplus._M_p = (pointer)&subset_abs_path._prim_part.field_2;
      subset_abs_path._prim_part._M_string_length = 0;
      subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._prop_part._M_dataplus._M_p = (pointer)&subset_abs_path._prop_part.field_2;
      subset_abs_path._prop_part._M_string_length = 0;
      subset_abs_path._prop_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._variant_part._M_dataplus._M_p =
           (pointer)&subset_abs_path._variant_part.field_2;
      subset_abs_path._variant_part._M_string_length = 0;
      subset_abs_path._variant_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._variant_selection_part._M_dataplus._M_p =
           (pointer)&subset_abs_path._variant_selection_part.field_2;
      subset_abs_path._variant_selection_part._M_string_length = 0;
      subset_abs_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._variant_part_str._M_dataplus._M_p =
           (pointer)&subset_abs_path._variant_part_str.field_2;
      subset_abs_path._variant_part_str._M_string_length = 0;
      subset_abs_path._variant_part_str.field_2._M_local_buf[0] = '\0';
      paVar16 = &subset_abs_path._element.field_2;
      subset_abs_path._element._M_string_length = 0;
      subset_abs_path._element.field_2._M_local_buf[0] = '\0';
      subset_abs_path._path_type.has_value_ = false;
      subset_abs_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      subset_abs_path._valid = false;
      bound_material = (Material *)0x0;
      pSVar5 = visitorEnv->env->stage;
      paVar1 = &backface_purpose.field_2;
      backface_purpose._M_dataplus._M_p = (pointer)paVar1;
      subset_abs_path._element._M_dataplus._M_p = (pointer)paVar16;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&backface_purpose,"");
      bVar9 = GetBoundMaterial(pSVar5,abs_path,&backface_purpose,&subset_abs_path,&bound_material,
                               err_local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)backface_purpose._M_dataplus._M_p != paVar1) {
        operator_delete(backface_purpose._M_dataplus._M_p,
                        backface_purpose.field_2._M_allocated_capacity + 1);
      }
      mesh = local_598;
      paVar15 = &subset_abs_path._prop_part.field_2;
      if (bVar9 && bound_material != (Material *)0x0) {
        rmaterial_id = -1;
        bVar9 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                          (&ConvertBoundMaterial,&subset_abs_path,bound_material,&rmaterial_id);
        if (!bVar9) {
          if (err_local != (string *)0x0) {
            Path::full_path_name_abi_cxx11_(&local_7c8,&subset_abs_path);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backface_purpose,"Convert boundMaterial failed: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_7c8);
            ::std::__cxx11::string::_M_append
                      ((char *)err_local,(ulong)backface_purpose._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)backface_purpose._M_dataplus._M_p != paVar1) {
              operator_delete(backface_purpose._M_dataplus._M_p,
                              backface_purpose.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
              operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          Path::~Path(&subset_abs_path);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psubset != &local_650) {
            operator_delete(psubset,CONCAT71(local_650._M_allocated_capacity._1_7_,
                                             local_650._M_local_buf[0]) + 1);
          }
          this_00 = &material_path;
LAB_003513cb:
          MaterialPath::~MaterialPath(this_00);
LAB_003513d0:
          if (local_688.
              super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_688.
                            super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_688.
                                  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_688.
                                  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
          ::_M_erase(&subset_material_path_map._M_t,
                     (_Link_type)
                     subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                    );
          goto LAB_0034f702;
        }
        Path::full_path_name_abi_cxx11_(&backface_purpose,&subset_abs_path);
        ::std::__cxx11::string::operator=((string *)&material_path,(string *)&backface_purpose);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)backface_purpose._M_dataplus._M_p != paVar1) {
          operator_delete(backface_purpose._M_dataplus._M_p,
                          backface_purpose.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subset_abs_path._element._M_dataplus._M_p != paVar16) {
        operator_delete(subset_abs_path._element._M_dataplus._M_p,
                        CONCAT71(subset_abs_path._element.field_2._M_allocated_capacity._1_7_,
                                 subset_abs_path._element.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subset_abs_path._variant_part_str._M_dataplus._M_p !=
          &subset_abs_path._variant_part_str.field_2) {
        operator_delete(subset_abs_path._variant_part_str._M_dataplus._M_p,
                        CONCAT71(subset_abs_path._variant_part_str.field_2._M_allocated_capacity.
                                 _1_7_,subset_abs_path._variant_part_str.field_2._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subset_abs_path._variant_selection_part._M_dataplus._M_p !=
          &subset_abs_path._variant_selection_part.field_2) {
        operator_delete(subset_abs_path._variant_selection_part._M_dataplus._M_p,
                        CONCAT71(subset_abs_path._variant_selection_part.field_2.
                                 _M_allocated_capacity._1_7_,
                                 subset_abs_path._variant_selection_part.field_2._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subset_abs_path._variant_part._M_dataplus._M_p !=
          &subset_abs_path._variant_part.field_2) {
        operator_delete(subset_abs_path._variant_part._M_dataplus._M_p,
                        CONCAT71(subset_abs_path._variant_part.field_2._M_allocated_capacity._1_7_,
                                 subset_abs_path._variant_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subset_abs_path._prop_part._M_dataplus._M_p != paVar15) {
        operator_delete(subset_abs_path._prop_part._M_dataplus._M_p,
                        CONCAT71(subset_abs_path._prop_part.field_2._M_allocated_capacity._1_7_,
                                 subset_abs_path._prop_part.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)subset_abs_path._prim_part._M_dataplus._M_p != &subset_abs_path._prim_part.field_2) {
        operator_delete(subset_abs_path._prim_part._M_dataplus._M_p,
                        CONCAT71(subset_abs_path._prim_part.field_2._M_allocated_capacity._1_7_,
                                 subset_abs_path._prim_part.field_2._M_local_buf[0]) + 1);
      }
      pcVar6 = (visitorEnv->env->material_config).default_backface_material_purpose_name._M_dataplus
               ._M_p;
      backface_purpose._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&backface_purpose,pcVar6,
                 pcVar6 + (visitorEnv->env->material_config).default_backface_material_purpose_name.
                          _M_string_length);
      paVar3 = &subset_abs_path._prim_part.field_2;
      if (backface_purpose._M_string_length == 0) {
LAB_00350773:
        subset_abs_path._prim_part._M_string_length = 0;
        subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        args = (RenderMesh *)&subset_abs_path;
        subset_abs_path._prim_part._M_dataplus._M_p = (pointer)paVar3;
        GetBlendShapes((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                        *)&bound_material,visitorEnv->env->stage,local_5a0,
                       (string *)&subset_abs_path);
        rmaterial_id_1 = (int64_t)bound_material;
        ppStack_5b0 = ppStack_770;
        local_5a8 = (pointer)local_768._M_allocated_capacity;
        local_7c8._M_dataplus._M_p = (pointer)0x0;
        local_7c8._M_string_length = 0;
        local_7c8.field_2._M_allocated_capacity = 0;
        bound_material = (Material *)0x0;
        ppStack_770 = (pointer)0x0;
        local_768._M_allocated_capacity = 0;
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   *)&local_7c8);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   *)&bound_material);
        if ((subset_abs_path._prim_part._M_string_length != 0) && (err_local != (string *)0x0)) {
          bound_material = (Material *)&local_768;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&bound_material,"Failed to get BlendShapes prims. err = {}","");
          fmt::format<std::__cxx11::string>
                    ((string *)&local_7c8,(fmt *)&bound_material,&subset_abs_path._prim_part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          ::std::__cxx11::string::_M_append((char *)err_local,(ulong)local_7c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)bound_material != &local_768) {
            operator_delete(bound_material,(ulong)(local_768._M_allocated_capacity + 1));
          }
        }
        paVar16 = &subset_abs_path._prim_part.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)subset_abs_path._prim_part._M_dataplus._M_p != paVar16) {
          operator_delete(subset_abs_path._prim_part._M_dataplus._M_p,
                          CONCAT71(subset_abs_path._prim_part.field_2._M_allocated_capacity._1_7_,
                                   subset_abs_path._prim_part.field_2._M_local_buf[0]) + 1);
        }
        subset_abs_path._prim_part._M_string_length = 0;
        subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._prop_part._M_string_length = 0;
        subset_abs_path._prop_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_part._M_dataplus._M_p =
             (pointer)&subset_abs_path._variant_part.field_2;
        subset_abs_path._variant_part._M_string_length = 0;
        subset_abs_path._variant_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_selection_part._M_dataplus._M_p =
             subset_abs_path._variant_selection_part._M_dataplus._M_p & 0xffffffffffffff00;
        subset_abs_path._prim_part._M_dataplus._M_p = (pointer)paVar16;
        subset_abs_path._prop_part._M_dataplus._M_p = (pointer)paVar15;
        memset(&subset_abs_path._variant_selection_part._M_string_length,0,0xa8);
        local_390._M_left = &local_390;
        local_390._M_color = _S_red;
        local_390._M_parent = (_Base_ptr)0x0;
        local_370 = 0;
        local_360._M_left = &local_360;
        local_360._M_color = _S_red;
        local_360._M_parent = (_Base_ptr)0x0;
        local_340 = 0;
        local_338._M_p = (pointer)&local_328;
        local_330 = 0;
        local_328._M_local_buf[0] = '\0';
        local_318._0_4_ = Vec3;
        local_318._4_4_ = 1;
        local_310 = 0;
        local_2e8 = (pointer)0x0;
        puStack_2e0 = (pointer)0x0;
        local_2f8 = (pointer)0x0;
        puStack_2f0 = (pointer)0x0;
        local_308 = (pointer)0x0;
        puStack_300 = (pointer)0x0;
        local_2d8 = Vertex;
        local_2d0 = 0;
        local_2c8._M_p = (pointer)&local_2b8;
        local_2c0 = 0;
        local_2b8._M_local_buf[0] = '\0';
        local_2a8._0_4_ = Vec3;
        local_2a8._4_4_ = 1;
        local_2a0 = 0;
        local_298 = (pointer)0x0;
        puStack_290 = (pointer)0x0;
        local_288 = (pointer)0x0;
        puStack_280 = (pointer)0x0;
        local_278 = (pointer)0x0;
        puStack_270 = (pointer)0x0;
        local_268 = Vertex;
        local_260 = 0;
        local_258 = false;
        local_254._0_4_ = 0.18;
        local_254._4_4_ = 0.18;
        local_254._8_4_ = 0.18;
        local_254._12_4_ = 1.0;
        local_244 = true;
        local_240._M_p = (pointer)&local_230;
        local_238 = 0;
        local_230._M_local_buf[0] = '\0';
        local_220._0_4_ = Vec3;
        local_220._4_4_ = 1;
        local_218 = 0;
        local_1f0 = (pointer)0x0;
        puStack_1e8 = (pointer)0x0;
        local_200 = (pointer)0x0;
        puStack_1f8 = (pointer)0x0;
        local_210 = (pointer)0x0;
        puStack_208 = (pointer)0x0;
        local_1e0 = Vertex;
        local_1d8 = 0;
        local_1d0._M_p = (pointer)&local_1c0;
        local_1c8 = 0;
        local_1c0._M_local_buf[0] = '\0';
        local_1b0._0_4_ = Vec3;
        local_1b0._4_4_ = 1;
        local_1a8 = 0;
        local_180 = (pointer)0x0;
        puStack_178 = (pointer)0x0;
        local_190 = (pointer)0x0;
        puStack_188 = (pointer)0x0;
        local_1a0 = (pointer)0x0;
        puStack_198 = (pointer)0x0;
        local_170 = Vertex;
        local_168 = 0;
        local_160 = 1.0;
        local_148 = 0.0;
        dStack_140 = 0.0;
        local_158 = 0.0;
        dStack_150 = 0.0;
        local_138 = 1.0;
        local_120 = 0.0;
        dStack_118 = 0.0;
        local_130 = 0.0;
        dStack_128 = 0.0;
        local_110 = 1.0;
        local_f8 = 0.0;
        dStack_f0 = 0.0;
        local_108 = 0.0;
        dStack_100 = 0.0;
        local_e8 = 1.0;
        local_c0 = (pointer)0x0;
        pfStack_b8 = (pointer)0x0;
        local_d0 = (pointer)0x0;
        pfStack_c8 = (pointer)0x0;
        local_e0 = (pointer)0x0;
        piStack_d8 = (pointer)0x0;
        local_b0 = 1;
        local_a8 = -1;
        local_98._M_left = &local_98;
        local_98._M_color = _S_red;
        local_98._M_parent = (_Base_ptr)0x0;
        local_78 = 0;
        local_70._0_4_ = -1;
        local_70._4_4_ = -1;
        local_60._M_left = &local_60;
        local_60._M_color = _S_red;
        local_60._M_parent = (_Base_ptr)0x0;
        local_40 = 0;
        uStack_38 = 0;
        local_390._M_right = local_390._M_left;
        local_360._M_right = local_360._M_left;
        local_98._M_right = local_98._M_left;
        local_60._M_right = local_60._M_left;
        bVar9 = RenderSceneConverter::ConvertMesh
                          (visitorEnv->converter,visitorEnv->env,abs_path,mesh,&material_path,
                           &subset_material_path_map,&visitorEnv->converter->materialMap,&local_688,
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                            *)&rmaterial_id_1,(RenderMesh *)&subset_abs_path);
        if (bVar9) {
          pRVar7 = visitorEnv->converter;
          val = ((long)(pRVar7->meshes).
                       super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pRVar7->meshes).
                       super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x7063e7063e7063e7;
          if (val < 0x7fffffff) {
            Path::full_path_name_abi_cxx11_(&local_7c8,abs_path);
            StringAndIdMap::add(&pRVar7->meshMap,&local_7c8,val);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
              operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
            ::emplace_back<tinyusdz::tydra::RenderMesh>
                      (&visitorEnv->converter->meshes,(RenderMesh *)&subset_abs_path);
            bVar9 = true;
          }
          else {
            if (err_local != (string *)0x0) {
              ::std::__cxx11::string::append((char *)err_local);
            }
            bVar9 = false;
          }
        }
        else {
          if (err_local != (string *)0x0) {
            bound_material = (Material *)&local_768;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&bound_material,"Mesh conversion failed: {}","");
            Path::full_path_name_abi_cxx11_((string *)&rmaterial_id,abs_path);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_7c8,(fmt *)&bound_material,(string *)&rmaterial_id,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mesh);
            ::std::__cxx11::string::_M_append((char *)err_local,(ulong)local_7c8._M_dataplus._M_p);
            paVar1 = &local_7c8.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rmaterial_id != &local_5c8) {
              operator_delete((void *)rmaterial_id,local_5c8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)bound_material != &local_768) {
              operator_delete(bound_material,(ulong)(local_768._M_allocated_capacity + 1));
            }
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bound_material,"\n",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &visitorEnv->converter->_err);
            plVar12 = (long *)::std::__cxx11::string::append((char *)&bound_material);
            psVar13 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_7c8.field_2._M_allocated_capacity = *psVar13;
              local_7c8.field_2._8_8_ = plVar12[3];
              local_7c8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_7c8.field_2._M_allocated_capacity = *psVar13;
              local_7c8._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_7c8._M_string_length = plVar12[1];
            *plVar12 = (long)psVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)err_local,(ulong)local_7c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)bound_material != &local_768) {
              operator_delete(bound_material,(ulong)(local_768._M_allocated_capacity + 1));
            }
          }
          bVar9 = false;
        }
        RenderMesh::~RenderMesh((RenderMesh *)&subset_abs_path);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   *)&rmaterial_id_1);
      }
      else {
        subset_abs_path._prim_part._M_string_length = 0;
        subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._prim_part._M_dataplus._M_p = (pointer)paVar3;
        ::std::__cxx11::string::_M_assign((string *)&subset_abs_path);
        bVar9 = MaterialBinding::has_materialBinding
                          (&(mesh->super_GPrim).super_MaterialBinding,(token *)&subset_abs_path);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)subset_abs_path._prim_part._M_dataplus._M_p != paVar3) {
          operator_delete(subset_abs_path._prim_part._M_dataplus._M_p,
                          CONCAT71(subset_abs_path._prim_part.field_2._M_allocated_capacity._1_7_,
                                   subset_abs_path._prim_part.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar9) goto LAB_00350773;
        subset_abs_path._prim_part._M_string_length = 0;
        subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._prop_part._M_string_length = 0;
        subset_abs_path._prop_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_part._M_dataplus._M_p =
             (pointer)&subset_abs_path._variant_part.field_2;
        subset_abs_path._variant_part._M_string_length = 0;
        subset_abs_path._variant_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_selection_part._M_dataplus._M_p =
             (pointer)&subset_abs_path._variant_selection_part.field_2;
        subset_abs_path._variant_selection_part._M_string_length = 0;
        subset_abs_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_part_str._M_dataplus._M_p =
             (pointer)&subset_abs_path._variant_part_str.field_2;
        subset_abs_path._variant_part_str._M_string_length = 0;
        subset_abs_path._variant_part_str.field_2._M_local_buf[0] = '\0';
        subset_abs_path._element._M_string_length = 0;
        subset_abs_path._element.field_2._M_local_buf[0] = '\0';
        subset_abs_path._path_type.has_value_ = false;
        subset_abs_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        subset_abs_path._valid = false;
        rmaterial_id = 0;
        subset_abs_path._prim_part._M_dataplus._M_p = (pointer)paVar3;
        subset_abs_path._prop_part._M_dataplus._M_p = (pointer)paVar15;
        subset_abs_path._element._M_dataplus._M_p = (pointer)paVar16;
        bVar9 = GetBoundMaterial(visitorEnv->env->stage,abs_path,
                                 &(visitorEnv->env->material_config).
                                  default_backface_material_purpose_name,&subset_abs_path,
                                 (Material **)&rmaterial_id,err_local);
        if (rmaterial_id == 0 || !bVar9) {
LAB_003506ad:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._element._M_dataplus._M_p != paVar16) {
            operator_delete(subset_abs_path._element._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._element.field_2._M_allocated_capacity._1_7_,
                                     subset_abs_path._element.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._variant_part_str._M_dataplus._M_p !=
              &subset_abs_path._variant_part_str.field_2) {
            operator_delete(subset_abs_path._variant_part_str._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._variant_part_str.field_2._M_allocated_capacity
                                     ._1_7_,subset_abs_path._variant_part_str.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._variant_selection_part._M_dataplus._M_p !=
              &subset_abs_path._variant_selection_part.field_2) {
            operator_delete(subset_abs_path._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._variant_selection_part.field_2.
                                     _M_allocated_capacity._1_7_,
                                     subset_abs_path._variant_selection_part.field_2._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._variant_part._M_dataplus._M_p !=
              &subset_abs_path._variant_part.field_2) {
            operator_delete(subset_abs_path._variant_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._variant_part.field_2._M_allocated_capacity.
                                     _1_7_,subset_abs_path._variant_part.field_2._M_local_buf[0]) +
                            1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._prop_part._M_dataplus._M_p != paVar15) {
            operator_delete(subset_abs_path._prop_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._prop_part.field_2._M_allocated_capacity._1_7_,
                                     subset_abs_path._prop_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)subset_abs_path._prim_part._M_dataplus._M_p != paVar3) {
            operator_delete(subset_abs_path._prim_part._M_dataplus._M_p,
                            CONCAT71(subset_abs_path._prim_part.field_2._M_allocated_capacity._1_7_,
                                     subset_abs_path._prim_part.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_00350773;
        }
        rmaterial_id_1 = -1;
        bVar9 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                          (&ConvertBoundMaterial,&subset_abs_path,(Material *)rmaterial_id,
                           &rmaterial_id_1);
        if (bVar9) {
          Path::full_path_name_abi_cxx11_(&local_7c8,&subset_abs_path);
          ::std::__cxx11::string::operator=
                    ((string *)&material_path.backface_material_path,(string *)&local_7c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_003506ad;
        }
        if (err_local != (string *)0x0) {
          Path::full_path_name_abi_cxx11_((string *)&bound_material,&subset_abs_path);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_7c8,"Convert boundMaterial failed: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &bound_material);
          ::std::__cxx11::string::_M_append((char *)err_local,(ulong)local_7c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)bound_material != &local_768) {
            operator_delete(bound_material,(ulong)(local_768._M_allocated_capacity + 1));
          }
        }
        Path::~Path(&subset_abs_path);
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)backface_purpose._M_dataplus._M_p != &backface_purpose.field_2) {
        operator_delete(backface_purpose._M_dataplus._M_p,
                        backface_purpose.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psubset != &local_650) {
        operator_delete(psubset,CONCAT71(local_650._M_allocated_capacity._1_7_,
                                         local_650._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)material_path.default_texcoords_primvar_name._M_dataplus._M_p !=
          &material_path.default_texcoords_primvar_name.field_2) {
        operator_delete(material_path.default_texcoords_primvar_name._M_dataplus._M_p,
                        CONCAT53(material_path.default_texcoords_primvar_name.field_2.
                                 _M_allocated_capacity._3_5_,
                                 CONCAT12(material_path.default_texcoords_primvar_name.field_2.
                                          _M_local_buf[2],
                                          material_path.default_texcoords_primvar_name.field_2.
                                          _M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)material_path.backface_material_path._M_dataplus._M_p !=
          &material_path.backface_material_path.field_2) {
        operator_delete(material_path.backface_material_path._M_dataplus._M_p,
                        CONCAT71(material_path.backface_material_path.field_2._M_allocated_capacity.
                                 _1_7_,material_path.backface_material_path.field_2._M_local_buf[0])
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)material_path.material_path._M_dataplus._M_p != &material_path.material_path.field_2) {
        operator_delete(material_path.material_path._M_dataplus._M_p,
                        material_path.material_path.field_2._M_allocated_capacity + 1);
      }
      if (local_688.
          super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_688.
                        super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_688.
                              super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_688.
                              super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
      ::_M_erase(&subset_material_path_map._M_t,
                 (_Link_type)
                 subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      if (!bVar9) goto LAB_0034f702;
    }
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool MeshVisitor(const tinyusdz::Path &abs_path, const tinyusdz::Prim &prim,
                 const int32_t level, void *userdata, std::string *err) {
  if (!userdata) {
    if (err) {
      (*err) += "userdata pointer must be filled.";
    }
    return false;
  }

  MeshVisitorEnv *visitorEnv = reinterpret_cast<MeshVisitorEnv *>(userdata);

  if (level > 1024 * 1024) {
    if (err) {
      (*err) += "Scene graph is too deep.\n";
    }
    // Too deep
    return false;
  }

  if (const tinyusdz::GeomMesh *pmesh = prim.as<tinyusdz::GeomMesh>()) {
    // Collect GeomSubsets
    // std::vector<const tinyusdz::GeomSubset *> subsets = GetGeomSubsets(;

    DCOUT("Mesh: " << abs_path);

    if (!pmesh->points.authored()) {
      // Maybe Collider mesh? Ignore for now.
      DCOUT(fmt::format("Mesh {} does not author `points` attribute(Maybe Collider mesh?). Ignore it for now", abs_path));
      return true;
    }

    //
    // First convert Material assigned to GeomMesh.
    //
    // - If prim has GeomSubset with materialBind, convert it to per-face
    // material.
    // - If prim has materialBind, convert it to RenderMesh's material.
    //

    auto ConvertBoundMaterial = [&](const Path &bound_material_path,
                                    const tinyusdz::Material *bound_material,
                                    int64_t &rmaterial_id) -> bool {
      std::vector<RenderMaterial> &rmaterials =
          visitorEnv->converter->materials;

      const auto matIt = visitorEnv->converter->materialMap.find(
          bound_material_path.full_path_name());

      if (matIt != visitorEnv->converter->materialMap.s_end()) {
        // Got material in the cache.
        uint64_t mat_id = matIt->second;
        if (mat_id >= visitorEnv->converter->materials
                          .size()) {  // this should not happen though
          if (err) {
            (*err) += "Material index out-of-range.\n";
          }
          return false;
        }

        if (mat_id >= size_t((std::numeric_limits<int32_t>::max)())) {
          if (err) {
            (*err) += "Material index too large.\n";
          }
          return false;
        }

        rmaterial_id = int64_t(mat_id);

      } else {
        RenderMaterial rmat;
        if (!visitorEnv->converter->ConvertMaterial(*visitorEnv->env,
                                                    bound_material_path,
                                                    *bound_material, &rmat)) {
          if (err) {
            (*err) += fmt::format("Material conversion failed: {}",
                                  bound_material_path);
          }
          return false;
        }

        // Assign new material ID
        uint64_t mat_id = rmaterials.size();

        if (mat_id >= uint64_t((std::numeric_limits<int32_t>::max)())) {
          if (err) {
            (*err) += "Material index too large.\n";
          }
          return false;
        }
        rmaterial_id = int64_t(mat_id);

        visitorEnv->converter->materialMap.add(
            bound_material_path.full_path_name(), uint64_t(rmaterial_id));
        DCOUT("Added renderMaterial: " << mat_id << " " << rmat.abs_path
                                       << " ( " << rmat.name << " ) ");

        rmaterials.push_back(rmat);
      }

      return true;
    };

    // Convert bound materials in GeomSubsets
    //
    // key: subset Prim name
    std::map<std::string, MaterialPath> subset_material_path_map;
    std::vector<const GeomSubset *> material_subsets;
    {
      material_subsets = GetMaterialBindGeomSubsets(prim);

      for (const auto &psubset : material_subsets) {
        MaterialPath mpath;
        mpath.default_texcoords_primvar_name =
            visitorEnv->env->mesh_config.default_texcoords_primvar_name;

        Path subset_abs_path = abs_path.AppendElement(psubset->name);

        // front and back
        {
          tinyusdz::Path bound_material_path;
          const tinyusdz::Material *bound_material{nullptr};
          bool ret = tinyusdz::tydra::GetBoundMaterial(
              visitorEnv->env->stage,
              /* GeomSubset prim path */ subset_abs_path,
              /* purpose */ "", &bound_material_path, &bound_material, err);

          if (ret && bound_material) {
            int64_t rmaterial_id = -1;  // not used.

            if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                      rmaterial_id)) {
              if (err) {
                (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
              }
              return false;
            }

            mpath.material_path = bound_material_path.full_path_name();
            DCOUT("GeomSubset " << subset_abs_path << " : Bound material path: "
                                << mpath.backface_material_path);
          }
        }

        std::string backface_purpose =
            visitorEnv->env->material_config
                .default_backface_material_purpose_name;

        if (!backface_purpose.empty() &&
            psubset->has_materialBinding(value::token(backface_purpose))) {
          DCOUT("backface_material_purpose "
                << visitorEnv->env->material_config
                       .default_backface_material_purpose_name);
          tinyusdz::Path bound_material_path;
          const tinyusdz::Material *bound_material{nullptr};
          bool ret = tinyusdz::tydra::GetBoundMaterial(
              visitorEnv->env->stage,
              /* GeomSubset prim path */ subset_abs_path,
              /* purpose */
              visitorEnv->env->material_config
                  .default_backface_material_purpose_name,
              &bound_material_path, &bound_material, err);

          if (ret && bound_material) {
            int64_t rmaterial_id = -1;  // not used

            if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                      rmaterial_id)) {
              if (err) {
                (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
              }
              return false;
            }

            mpath.backface_material_path = bound_material_path.full_path_name();
            DCOUT("GeomSubset " << subset_abs_path
                                << " : Bound backface material path: "
                                << mpath.backface_material_path);
          }
        }

        subset_material_path_map[psubset->name] = mpath;
      }
    }

    MaterialPath material_path;
    material_path.default_texcoords_primvar_name =
        visitorEnv->env->mesh_config.default_texcoords_primvar_name;
    // TODO: Implement feature to assign default material
    // id(MaterialPath::default_material_id) when no bound material found.

    {
      const std::string mesh_path_str = abs_path.full_path_name();

      // Front and back material.
      {
        tinyusdz::Path bound_material_path;
        const tinyusdz::Material *bound_material{nullptr};
        bool ret = tinyusdz::tydra::GetBoundMaterial(
            visitorEnv->env->stage, /* GeomMesh prim path */ abs_path,
            /* purpose */ "", &bound_material_path, &bound_material, err);

        if (ret && bound_material) {
          int64_t rmaterial_id = -1;  // not used

          if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                    rmaterial_id)) {
            if (err) {
              (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
            }
            return false;
          }

          material_path.material_path = bound_material_path.full_path_name();
          DCOUT("Bound material path: " << material_path.material_path);
        }
      }

      std::string backface_purpose =
          visitorEnv->env->material_config
              .default_backface_material_purpose_name;

      if (!backface_purpose.empty() &&
          pmesh->has_materialBinding(value::token(backface_purpose))) {
        tinyusdz::Path bound_material_path;
        const tinyusdz::Material *bound_material{nullptr};
        bool ret = tinyusdz::tydra::GetBoundMaterial(
            visitorEnv->env->stage, /* GeomMesh prim path */ abs_path,
            /* purpose */
            visitorEnv->env->material_config
                .default_backface_material_purpose_name,
            &bound_material_path, &bound_material, err);

        if (ret && bound_material) {
          int64_t rmaterial_id = -1;  // not used

          if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                    rmaterial_id)) {
            if (err) {
              (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
            }
            return false;
          }

          material_path.backface_material_path =
              bound_material_path.full_path_name();
          DCOUT("Bound backface material path: "
                << material_path.backface_material_path);
        }
      }

      // BlendShapes
      std::vector<std::pair<std::string, const BlendShape *>> blendshapes;
      {
        std::string local_err;
        blendshapes = GetBlendShapes(visitorEnv->env->stage, prim, &local_err);
        if (local_err.size()) {
          if (err) {
            (*err) += fmt::format("Failed to get BlendShapes prims. err = {}", local_err);
          }
        }
      }
      DCOUT("# of blendshapes : " << blendshapes.size());

      RenderMesh rmesh;

      if (!visitorEnv->converter->ConvertMesh(
              *visitorEnv->env, abs_path, *pmesh, material_path,
              subset_material_path_map, visitorEnv->converter->materialMap,
              material_subsets, blendshapes, &rmesh)) {
        if (err) {
          (*err) += fmt::format("Mesh conversion failed: {}",
                                abs_path.full_path_name());
          (*err) += "\n" + visitorEnv->converter->GetError() + "\n";

        }
        return false;
      }

      uint64_t mesh_id = uint64_t(visitorEnv->converter->meshes.size());
      if (mesh_id >= size_t((std::numeric_limits<int32_t>::max)())) {
        if (err) {
          (*err) += "Mesh index too large.\n";
        }
        return false;
      }
      visitorEnv->converter->meshMap.add(abs_path.full_path_name(), mesh_id);

      visitorEnv->converter->meshes.emplace_back(std::move(rmesh));
    }
  }

  return true;  // continue traversal
}